

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

void __thiscall mkvparser::Chapters::Atom::Clear(Atom *this)

{
  uint uVar1;
  
  if (this->m_string_uid != (char *)0x0) {
    operator_delete__(this->m_string_uid);
  }
  this->m_string_uid = (char *)0x0;
  while (0 < this->m_displays_count) {
    uVar1 = this->m_displays_count - 1;
    this->m_displays_count = uVar1;
    Display::Clear(this->m_displays + uVar1);
  }
  if (this->m_displays != (Display *)0x0) {
    operator_delete__(&this->m_displays[-1].m_country);
  }
  this->m_displays = (Display *)0x0;
  this->m_displays_size = 0;
  return;
}

Assistant:

void Chapters::Atom::Clear() {
  delete[] m_string_uid;
  m_string_uid = NULL;

  while (m_displays_count > 0) {
    Display& d = m_displays[--m_displays_count];
    d.Clear();
  }

  delete[] m_displays;
  m_displays = NULL;

  m_displays_size = 0;
}